

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O1

TransformDerivative * __thiscall
iDynTree::Axis::getRotationTransformDerivative
          (TransformDerivative *__return_storage_ptr__,Axis *this,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3 translationPositionDerivative;
  Matrix3x3 local_68;
  
  Rotation::RotAxisDerivative(&local_68,&this->direction,theta);
  TransformDerivative::setRotationDerivative(__return_storage_ptr__,&local_68);
  dVar7 = cos(theta);
  dVar8 = sin(theta);
  dVar1 = (this->direction).super_Vector3.m_data[2];
  dVar2 = (this->origin).super_Vector3.m_data[2];
  dVar3 = (this->direction).super_Vector3.m_data[0];
  dVar4 = (this->direction).super_Vector3.m_data[1];
  dVar5 = (this->origin).super_Vector3.m_data[0];
  dVar6 = (this->origin).super_Vector3.m_data[1];
  local_68.m_data[0] =
       dVar8 * ((dVar1 * dVar1 + dVar4 * dVar4) * dVar5 - (dVar1 * dVar2 + dVar6 * dVar4) * dVar3) +
       dVar7 * (dVar1 * dVar6 - dVar4 * dVar2);
  local_68.m_data[1] =
       dVar8 * ((dVar1 * dVar1 + dVar3 * dVar3) * dVar6 - (dVar1 * dVar2 + dVar5 * dVar3) * dVar4) +
       dVar7 * (dVar3 * dVar2 - dVar1 * dVar5);
  local_68.m_data[2] =
       ((dVar4 * dVar4 + dVar3 * dVar3) * dVar2 - (dVar5 * dVar3 + dVar4 * dVar6) * dVar1) * dVar8 +
       (dVar4 * dVar5 - dVar6 * dVar3) * dVar7;
  TransformDerivative::setPositionDerivative(__return_storage_ptr__,(Vector3 *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

TransformDerivative Axis::getRotationTransformDerivative(const double theta) const
    {
        // Formula for rotation around and arbitrary axis given by
        // http://inside.mines.edu/fs_home/gmurray/ArbitraryAxisRotation/
        // In this function we
        TransformDerivative derivative_nonRotated_T_rotated;

        // rotation
        derivative_nonRotated_T_rotated.setRotationDerivative(Rotation::RotAxisDerivative(this->getDirection(),theta));

        // translation
        double cost = cos(theta);
        double sint = sin(theta);
        double u   = this->getDirection()(0);
        double u2  = u*u;
        double v   = this->getDirection()(1);
        double v2  = v*v;
        double w   = this->getDirection()(2);
        double w2  = w*w;
        double a    = this->getOrigin()(0);
        double b    = this->getOrigin()(1);
        double c    = this->getOrigin()(2);

        Vector3 translationPositionDerivative;
        translationPositionDerivative(0) =
            (a*(v2+w2) - u*(b*v+c*w))*(sint) + (b*w-c*v)*cost;
        translationPositionDerivative(1) =
            (b*(u2+w2) - v*(a*u+c*w))*(sint) + (c*u-a*w)*cost;
        translationPositionDerivative(2) =
            (c*(u2+v2) - w*(a*u+b*v))*(sint) + (a*v-b*u)*cost;

        derivative_nonRotated_T_rotated.setPositionDerivative(translationPositionDerivative);

        return derivative_nonRotated_T_rotated;
    }